

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

int __thiscall libtorrent::aux::utp_socket_impl::packet_timeout(utp_socket_impl *this)

{
  int iVar1;
  int iVar2;
  session_settings *psVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  unique_lock<std::mutex> local_30;
  
  if ((this->field_0x21c & 0x1c) != 0) {
    iVar5 = 60000;
    if (this->m_num_timeouts < 7) {
      psVar3 = this->m_sm->m_sett;
      local_30._M_device = &psVar3->m_mutex;
      local_30._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      iVar5 = (psVar3->m_store).m_ints._M_elems[0x59];
      ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
      iVar2 = (this->m_rtt).m_num_samples;
      iVar6 = 0;
      iVar4 = 0;
      if (0 < iVar2) {
        iVar4 = (this->m_rtt).m_mean;
        iVar1 = iVar4 + 0x20;
        iVar4 = iVar4 + 0x5f;
        if (-1 < iVar1) {
          iVar4 = iVar1;
        }
        iVar4 = iVar4 >> 6;
      }
      if (1 < iVar2) {
        iVar6 = (this->m_rtt).m_average_deviation;
        iVar2 = iVar6 + 0x20;
        iVar6 = iVar6 + 0x5f;
        if (-1 < iVar2) {
          iVar6 = iVar2;
        }
        iVar6 = (iVar6 >> 6) * 2;
      }
      iVar2 = iVar6 + iVar4;
      if (iVar6 + iVar4 < iVar5) {
        iVar2 = iVar5;
      }
      iVar5 = 0;
      if (this->m_num_timeouts != '\0') {
        iVar5 = 1000 << (this->m_num_timeouts - 1 & 0x1f);
      }
      iVar5 = iVar5 + iVar2;
      if (59999 < iVar5) {
        iVar5 = 60000;
      }
    }
    return iVar5;
  }
  return 3000;
}

Assistant:

int utp_socket_impl::packet_timeout() const
{
	INVARIANT_CHECK;

	// SYN packets have a bit longer timeout, since we don't
	// have an RTT estimate yet, make a conservative guess
	if (state() == state_t::none) return 3000;

	// avoid overflow by simply capping based on number of timeouts as well
	if (m_num_timeouts >= 7) return 60000;

	int timeout = std::max(m_sm.min_timeout(), m_rtt.mean() + m_rtt.avg_deviation() * 2);
	if (m_num_timeouts > 0) timeout += (1 << (int(m_num_timeouts) - 1)) * 1000;

	// timeouts over 1 minute are capped
	if (timeout > 60000) timeout = 60000;
	return timeout;
}